

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playermenu.cpp
# Opt level: O2

bool __thiscall FValueTextItem::MenuEvent(FValueTextItem *this,int mkey,bool fromcontroller)

{
  int iVar1;
  int iVar2;
  FSoundID local_10;
  FSoundID local_c;
  
  if (1 < (this->mSelections).Count) {
    if ((mkey == 6) || (mkey == 3)) {
      local_10.ID = S_FindSound("menu/change");
      S_Sound(0x22,&local_10,snd_menuvolume.Value,0.0);
      iVar1 = this->mSelection + 1;
      iVar2 = 0;
      if (iVar1 < (int)(this->mSelections).Count) {
        iVar2 = iVar1;
      }
      this->mSelection = iVar2;
      return true;
    }
    if (mkey == 2) {
      local_c.ID = S_FindSound("menu/change");
      S_Sound(0x22,&local_c,snd_menuvolume.Value,0.0);
      iVar2 = this->mSelection;
      this->mSelection = iVar2 + -1;
      if (0 < iVar2) {
        return true;
      }
      this->mSelection = (this->mSelections).Count - 1;
      return true;
    }
  }
  return mkey == 6;
}

Assistant:

bool FValueTextItem::MenuEvent (int mkey, bool fromcontroller)
{
	if (mSelections.Size() > 1)
	{
		if (mkey == MKEY_Left)
		{
			S_Sound (CHAN_VOICE | CHAN_UI, "menu/change", snd_menuvolume, ATTN_NONE);
			if (--mSelection < 0) mSelection = mSelections.Size() - 1;
			return true;
		}
		else if (mkey == MKEY_Right || mkey == MKEY_Enter)
		{
			S_Sound (CHAN_VOICE | CHAN_UI, "menu/change", snd_menuvolume, ATTN_NONE);
			if (++mSelection >= (int)mSelections.Size()) mSelection = 0;
			return true;
		}
	}
	return (mkey == MKEY_Enter);	// needs to eat enter keys so that Activate won't get called
}